

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O1

void __thiscall vmips::Function::Function(Function *this,string *name,size_t argc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  size_t sVar5;
  undefined8 uVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  element_type *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_40;
  
  paVar1 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (name->_M_dataplus)._M_p;
  paVar2 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar6 = *(undefined8 *)((long)&name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->name).field_2 + 8) = uVar6;
  }
  else {
    (this->name)._M_dataplus._M_p = pcVar3;
    (this->name).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->name)._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar2;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  this->count = 0;
  this->memory_count = 0;
  (this->ra_location).identifier = 0xffffffffffffffff;
  (this->ra_location).offset = 0;
  (this->ra_location).size = 0;
  (this->ra_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ra_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->ra_location).status = Assigned;
  (this->pic_location).identifier = 0xffffffffffffffff;
  (this->pic_location).offset = 0;
  (this->pic_location).size = 0;
  (this->pic_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pic_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->pic_location).status = Assigned;
  (this->s8_location).identifier = 0xffffffffffffffff;
  (this->s8_location).offset = 0;
  (this->s8_location).size = 0;
  (this->s8_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->s8_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->s8_location).status = Assigned;
  (this->data_blocks).
  super__Vector_base<std::shared_ptr<vmips::Data>,_std::allocator<std::shared_ptr<vmips::Data>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->data_blocks).
  super__Vector_base<std::shared_ptr<vmips::Data>,_std::allocator<std::shared_ptr<vmips::Data>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->data_blocks).
  super__Vector_base<std::shared_ptr<vmips::Data>,_std::allocator<std::shared_ptr<vmips::Data>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mem_blocks).
  super__Vector_base<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mem_blocks).
  super__Vector_base<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mem_blocks).
  super__Vector_base<std::shared_ptr<vmips::MemoryLocation>,_std::allocator<std::shared_ptr<vmips::MemoryLocation>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->has_sub = false;
  this->allocated = false;
  this->stack_size = 0;
  this->sub_argc = 0;
  this->save_regs = 0;
  this->argc = argc;
  (this->cursor).super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->blocks).
  super__Vector_base<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cursor).super___shared_ptr<vmips::CFGNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->blocks).
  super__Vector_base<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks).
  super__Vector_base<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ra_location).status = Undetermined;
  this->memory_count = 1;
  (this->ra_location).identifier = 0;
  (this->ra_location).size = 4;
  get_special((vmips *)&local_48,sp);
  p_Var8 = p_Stack_40;
  peVar7 = local_48;
  local_48 = (element_type *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (this->ra_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->ra_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar7;
  (this->ra_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var8;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  (this->pic_location).status = Undetermined;
  sVar5 = this->memory_count;
  this->memory_count = sVar5 + 1;
  (this->pic_location).identifier = sVar5;
  (this->pic_location).size = 4;
  get_special((vmips *)&local_48,sp);
  p_Var8 = p_Stack_40;
  peVar7 = local_48;
  local_48 = (element_type *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (this->pic_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->pic_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar7;
  (this->pic_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var8;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
  }
  (this->s8_location).status = Undetermined;
  sVar5 = this->memory_count;
  this->memory_count = sVar5 + 1;
  (this->s8_location).identifier = sVar5;
  (this->s8_location).size = 4;
  get_special((vmips *)&local_48,sp);
  p_Var8 = p_Stack_40;
  peVar7 = local_48;
  local_48 = (element_type *)0x0;
  p_Stack_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var4 = (this->s8_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->s8_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar7;
  (this->s8_location).base.super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var8;
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (p_Stack_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_40);
    return;
  }
  return;
}

Assistant:

Function::Function(std::string name, size_t argc) : name(std::move(name)), argc(argc) {
    ra_location.status = MemoryLocation::Undetermined;
    ra_location.identifier = memory_count++;
    ra_location.size = 4;
    ra_location.base = get_special(SpecialReg::sp);

    pic_location.status = MemoryLocation::Undetermined;
    pic_location.identifier = memory_count++;
    pic_location.size = 4;
    pic_location.base = get_special(SpecialReg::sp);

    s8_location.status = MemoryLocation::Undetermined;
    s8_location.identifier = memory_count++;
    s8_location.size = 4;
    s8_location.base = get_special(SpecialReg::sp);
}